

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O1

bool __thiscall
iDynTree::InverseKinematics::updatePositionTarget
          (InverseKinematics *this,string *frameName,Span<const_double,__1L> targetValue,
          double positionWeight)

{
  char *pcVar1;
  char *pcVar2;
  Position aPStack_18 [24];
  
  if (targetValue.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    iDynTree::Position::Position(aPStack_18,3,targetValue.storage_.data_);
    pcVar2 = "";
    pcVar1 = "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics";
  }
  else {
    pcVar2 = "updatePositionTarget";
    pcVar1 = "Wrong size in input targetValue";
  }
  iDynTree::reportError("InverseKinematics",pcVar2,pcVar1);
  return false;
}

Assistant:

bool InverseKinematics::updatePositionTarget(const std::string& frameName,
                                                 iDynTree::Span<const double> targetValue,
                                                 const double positionWeight)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (targetValue.size() == expected_pos_size);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "updatePositionTarget",
                        "Wrong size in input targetValue");
            return false;
        }

        return this->updatePositionTarget(frameName, Position(targetValue), positionWeight);
    }